

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_stbvorbis_init_file
                    (char *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_stbvorbis *pVorbis)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ma_result mVar3;
  stb_vorbis *psVar4;
  
  mVar3 = ma_stbvorbis_init_internal((ma_decoding_backend_config *)pVorbis,(ma_stbvorbis *)pConfig);
  if (mVar3 == MA_SUCCESS) {
    mVar3 = MA_SUCCESS;
    psVar4 = stb_vorbis_open_filename(pFilePath,(int *)0x0,(stb_vorbis_alloc *)0x0);
    pVorbis->stb = psVar4;
    if (psVar4 == (stb_vorbis *)0x0) {
      mVar3 = MA_INVALID_FILE;
    }
    else {
      pVorbis->usingPushMode = 0;
      uVar1 = psVar4->sample_rate;
      uVar2 = psVar4->channels;
      pVorbis->channels = uVar2;
      pVorbis->sampleRate = uVar1;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_stbvorbis_init_file(const char* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_stbvorbis* pVorbis)
{
    ma_result result;

    result = ma_stbvorbis_init_internal(pConfig, pVorbis);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_VORBIS)
    {
        (void)pAllocationCallbacks; /* Don't know how to make use of this with stb_vorbis. */

        /* We can use stb_vorbis' pull mode for file based streams. */
        pVorbis->stb = stb_vorbis_open_filename(pFilePath, NULL, NULL);
        if (pVorbis->stb == NULL) {
            return MA_INVALID_FILE;
        }

        pVorbis->usingPushMode = MA_FALSE;

        result = ma_stbvorbis_post_init(pVorbis);
        if (result != MA_SUCCESS) {
            stb_vorbis_close(pVorbis->stb);
            return result;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. */
        (void)pFilePath;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}